

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void h2v2_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  JDIMENSION JVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  JSAMPROW pJVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long local_48;
  
  JVar1 = compptr->width_in_blocks;
  uVar2 = cinfo->image_width;
  iVar8 = cinfo->max_v_samp_factor;
  iVar12 = JVar1 * 0x10;
  if (-2 < iVar8 && 0 < (int)(iVar12 - uVar2)) {
    uVar13 = 0;
    do {
      memset(input_data[uVar13 - 1] + uVar2,(uint)input_data[uVar13 - 1][(ulong)uVar2 - 1],
             (ulong)(iVar12 + ~uVar2) + 1);
      uVar13 = uVar13 + 1;
    } while (iVar8 + 2 != uVar13);
  }
  if (0 < compptr->v_samp_factor) {
    iVar8 = cinfo->smoothing_factor * 0x10;
    iVar12 = cinfo->smoothing_factor * -0x50 + 0x4000;
    lVar9 = 0;
    local_48 = 0;
    do {
      pbVar3 = input_data[local_48 + -1];
      pbVar4 = input_data[local_48];
      pbVar5 = input_data[local_48 + 1];
      pbVar6 = input_data[local_48 + 2];
      pJVar7 = output_data[lVar9];
      local_48 = local_48 + 2;
      *pJVar7 = (JSAMPLE)(((uint)*pbVar6 * 3 + (uint)*pbVar3 * 3 + (uint)pbVar6[2] + (uint)pbVar3[2]
                          + (uint)pbVar6[1] * 2 + (uint)pbVar4[2] * 2 +
                            (uint)pbVar3[1] * 2 + ((uint)*pbVar5 + (uint)*pbVar4) * 2 +
                            (uint)pbVar5[2] * 2) * iVar8 +
                          ((uint)pbVar5[1] + (uint)pbVar4[1] + (uint)*pbVar5 + (uint)*pbVar4) *
                          iVar12 + 0x8000 >> 0x10);
      lVar11 = 0;
      do {
        lVar10 = lVar11;
        pJVar7[lVar10 + 1] =
             (JSAMPLE)(((uint)pbVar5[lVar10 * 2 + 3] + (uint)pbVar5[lVar10 * 2 + 2] +
                       (uint)pbVar4[lVar10 * 2 + 3] + (uint)pbVar4[lVar10 * 2 + 2]) * iVar12 +
                       ((uint)pbVar6[lVar10 * 2 + 1] +
                        (uint)pbVar3[lVar10 * 2 + 4] + (uint)pbVar3[lVar10 * 2 + 1] +
                        ((uint)pbVar5[lVar10 * 2 + 4] +
                        (uint)pbVar5[lVar10 * 2 + 1] +
                        (uint)pbVar4[lVar10 * 2 + 4] + (uint)pbVar4[lVar10 * 2 + 1] +
                        (uint)pbVar6[lVar10 * 2 + 3] + (uint)pbVar6[lVar10 * 2 + 2] +
                        (uint)pbVar3[lVar10 * 2 + 3] + (uint)pbVar3[lVar10 * 2 + 2]) * 2 +
                       (uint)pbVar6[lVar10 * 2 + 4]) * iVar8 + 0x8000 >> 0x10);
        lVar11 = lVar10 + 1;
      } while (JVar1 * 8 + -2 != (int)lVar11);
      pJVar7[lVar10 + 2] =
           (JSAMPLE)(((uint)pbVar6[lVar11 * 2 + 3] * 3 + (uint)pbVar3[lVar11 * 2 + 3] * 3 +
                      (uint)pbVar6[lVar11 * 2 + 1] + (uint)pbVar3[lVar11 * 2 + 1] +
                     (uint)pbVar6[lVar11 * 2 + 2] * 2 + (uint)pbVar4[lVar11 * 2 + 1] * 2 +
                     (uint)pbVar3[lVar11 * 2 + 2] * 2 +
                     ((uint)pbVar5[lVar11 * 2 + 3] + (uint)pbVar4[lVar11 * 2 + 3]) * 2 +
                     (uint)pbVar5[lVar11 * 2 + 1] * 2) * iVar8 +
                     ((uint)pbVar5[lVar11 * 2 + 2] + (uint)pbVar4[lVar11 * 2 + 2] +
                     (uint)pbVar5[lVar11 * 2 + 3] + (uint)pbVar4[lVar11 * 2 + 3]) * iVar12 + 0x8000
                    >> 0x10);
      lVar9 = lVar9 + 1;
    } while (lVar9 < compptr->v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_smooth_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                       JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr0, inptr1, above_ptr, below_ptr, outptr;
  JLONG membersum, neighsum, memberscale, neighscale;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
                    cinfo->image_width, output_cols * 2);

  /* We don't bother to form the individual "smoothed" input pixel values;
   * we can directly compute the output which is the average of the four
   * smoothed values.  Each of the four member pixels contributes a fraction
   * (1-8*SF) to its own smoothed image and a fraction SF to each of the three
   * other smoothed pixels, therefore a total fraction (1-5*SF)/4 to the final
   * output.  The four corner-adjacent neighbor pixels contribute a fraction
   * SF to just one smoothed pixel, or SF/4 to the final output; while the
   * eight edge-adjacent neighbors contribute SF to each of two smoothed
   * pixels, or SF/2 overall.  In order to use integer arithmetic, these
   * factors are scaled by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 16384 - cinfo->smoothing_factor * 80; /* scaled (1-5*SF)/4 */
  neighscale = cinfo->smoothing_factor * 16; /* scaled SF/4 */

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow + 1];
    above_ptr = input_data[inrow - 1];
    below_ptr = input_data[inrow + 2];

    /* Special case for first column: pretend column -1 is same as column 0 */
    membersum = inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1];
    neighsum = above_ptr[0] + above_ptr[1] + below_ptr[0] + below_ptr[1] +
               inptr0[0] + inptr0[2] + inptr1[0] + inptr1[2];
    neighsum += neighsum;
    neighsum += above_ptr[0] + above_ptr[2] + below_ptr[0] + below_ptr[2];
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
    inptr0 += 2;  inptr1 += 2;  above_ptr += 2;  below_ptr += 2;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      /* sum of pixels directly mapped to this output element */
      membersum = inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1];
      /* sum of edge-neighbor pixels */
      neighsum = above_ptr[0] + above_ptr[1] + below_ptr[0] + below_ptr[1] +
                 inptr0[-1] + inptr0[2] + inptr1[-1] + inptr1[2];
      /* The edge-neighbors count twice as much as corner-neighbors */
      neighsum += neighsum;
      /* Add in the corner-neighbors */
      neighsum += above_ptr[-1] + above_ptr[2] + below_ptr[-1] + below_ptr[2];
      /* form final output scaled up by 2^16 */
      membersum = membersum * memberscale + neighsum * neighscale;
      /* round, descale and output it */
      *outptr++ = (JSAMPLE)((membersum + 32768) >> 16);
      inptr0 += 2;  inptr1 += 2;  above_ptr += 2;  below_ptr += 2;
    }

    /* Special case for last column */
    membersum = inptr0[0] + inptr0[1] + inptr1[0] + inptr1[1];
    neighsum = above_ptr[0] + above_ptr[1] + below_ptr[0] + below_ptr[1] +
               inptr0[-1] + inptr0[1] + inptr1[-1] + inptr1[1];
    neighsum += neighsum;
    neighsum += above_ptr[-1] + above_ptr[1] + below_ptr[-1] + below_ptr[1];
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE)((membersum + 32768) >> 16);

    inrow += 2;
  }
}